

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::Contains(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  CellRelation CVar2;
  Iterator it;
  S2Point local_30;
  
  MutableS2ShapeIndex::Iterator::Iterator(&it,&this->index_,UNPOSITIONED);
  CVar2 = MutableS2ShapeIndex::Iterator::Locate(&it,(S2CellId)(target->id_).id_);
  if ((CVar2 == INDEXED) && (bVar1 = BoundaryApproxIntersects(this,&it,target), !bVar1)) {
    S2Cell::GetCenter(&local_30,target);
    bVar1 = Contains(this,&it,&local_30);
    return bVar1;
  }
  return false;
}

Assistant:

bool S2Loop::Contains(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" is disjoint from all index cells, it is not contained.
  // Similarly, if "target" is subdivided into one or more index cells then it
  // is not contained, since index cells are subdivided only if they (nearly)
  // intersect a sufficient number of edges.  (But note that if "target" itself
  // is an index cell then it may be contained, since it could be a cell with
  // no edges in the loop interior.)
  if (relation != S2ShapeIndex::INDEXED) return false;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return false;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}